

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveShImportObj(Parser *parser,int flags)

{
  StringLiteral *this;
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  undefined4 in_register_00000034;
  path local_d8;
  undefined1 local_b8 [40];
  undefined1 local_90 [16];
  Identifier ctorName;
  StringLiteral inputName;
  undefined1 local_38 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  int flags_local;
  Parser *parser_local;
  
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  bVar1 = Parser::parseExpressionList
                    ((Parser *)CONCAT44(in_register_00000034,flags),
                     (vector<Expression,_std::allocator<Expression>_> *)local_38,1,2);
  if (bVar1) {
    this = (StringLiteral *)((long)&ctorName._name.field_2 + 8);
    StringLiteral::StringLiteral(this);
    pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                       ((vector<Expression,_std::allocator<Expression>_> *)local_38,0);
    bVar1 = Expression::evaluateString(pvVar2,this,true);
    if (bVar1) {
      sVar3 = std::vector<Expression,_std::allocator<Expression>_>::size
                        ((vector<Expression,_std::allocator<Expression>_> *)local_38);
      if (sVar3 == 2) {
        Identifier::Identifier((Identifier *)(local_90 + 8));
        pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                           ((vector<Expression,_std::allocator<Expression>_> *)local_38,1);
        bVar1 = Expression::evaluateIdentifier(pvVar2,(Identifier *)(local_90 + 8));
        if (bVar1) {
          StringLiteral::path((path *)(local_b8 + 8),
                              (StringLiteral *)((long)&ctorName._name.field_2 + 8));
          std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                    ((path *)local_90,(Identifier *)(local_b8 + 8));
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                     local_90);
          std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::~unique_ptr
                    ((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                     local_90);
          ghc::filesystem::path::~path((path *)(local_b8 + 8));
        }
        else {
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (nullptr_t)0x0);
        }
        Identifier::~Identifier((Identifier *)(local_90 + 8));
      }
      else {
        StringLiteral::path(&local_d8,(StringLiteral *)((long)&ctorName._name.field_2 + 8));
        std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)local_b8);
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                   local_b8);
        std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::~unique_ptr
                  ((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                   local_b8);
        ghc::filesystem::path::~path(&local_d8);
      }
    }
    else {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
    }
    StringLiteral::~StringLiteral((StringLiteral *)((long)&ctorName._name.field_2 + 8));
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveShImportObj(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	return std::make_unique<DirectiveObjImport>(inputName.path());
}